

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

BrotliDecoderErrorCode SafeProcessCommands(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  size_t sVar4;
  byte *pbVar5;
  BackwardReferenceFromDecoder *pBVar6;
  BrotliDictionary *pBVar7;
  BrotliTransforms *pBVar8;
  undefined8 uVar9;
  uint uVar10;
  uint32_t uVar11;
  BrotliDecoderErrorCode BVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  HuffmanCode *pHVar21;
  byte bVar22;
  uint uVar23;
  byte *pbVar24;
  ulong uVar25;
  uint8_t *puVar26;
  uint uVar27;
  byte bVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  uint local_4c;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  if (3 < s->state - BROTLI_STATE_COMMAND_BEGIN) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  uVar10 = s->pos;
  uVar30 = s->loop_counter;
  uVar31 = (ulong)uVar30;
  br = &s->br;
  uVar32 = uVar30;
  switch(s->state) {
  case BROTLI_STATE_COMMAND_INNER:
    goto LAB_00104c2a;
  case BROTLI_STATE_COMMAND_POST_DECODE_LITERALS:
    goto switchD_00104950_caseD_9;
  case BROTLI_STATE_COMMAND_POST_WRAP_COPY:
    lVar13 = (long)(int)uVar10;
    goto LAB_001050b2;
  }
switchD_00104950_caseD_7:
  do {
    uVar32 = (uint)uVar31;
    s->state = BROTLI_STATE_COMMAND_BEGIN;
    uVar30 = uVar10;
    if (s->block_length[1] != 0) {
      local_38 = (byte *)(s->br).val_;
      uVar11 = (s->br).bit_pos_;
      local_40 = (s->br).next_in;
      local_48 = (byte *)(s->br).avail_in;
      pHVar21 = s->htree_command;
      iVar18 = 0;
      iVar29 = -8;
      iVar20 = -0x32;
      pbVar14 = local_38;
      pbVar5 = local_40;
      pbVar24 = local_48;
      while( true ) {
        pbVar24 = pbVar24 + -1;
        if (0xe < iVar20 + uVar11) break;
        if (pbVar24 == (byte *)0xffffffffffffffff) {
          iVar29 = SafeDecodeSymbol(pHVar21,br,&local_4c);
          uVar19 = local_4c;
          if (iVar29 == 0) goto LAB_001051d1;
          goto LAB_00104a84;
        }
        (s->br).val_ = (ulong)pbVar14 >> 8;
        pbVar14 = (byte *)((ulong)pbVar14 >> 8 | (ulong)*pbVar5 << 0x38);
        (s->br).val_ = (uint64_t)pbVar14;
        (s->br).bit_pos_ = iVar29 + uVar11;
        (s->br).avail_in = (size_t)pbVar24;
        (s->br).next_in = pbVar5 + 1;
        iVar18 = iVar18 + 8;
        iVar29 = iVar29 + -8;
        iVar20 = iVar20 + -8;
        pbVar5 = pbVar5 + 1;
      }
      iVar29 = uVar11 - iVar18;
      uVar31 = (ulong)pbVar14 >> ((byte)iVar29 & 0x3f);
      pHVar21 = pHVar21 + (uVar31 & 0xff);
      bVar1 = pHVar21->bits;
      if (8 < bVar1) {
        iVar29 = (uVar11 - iVar18) + 8;
        pHVar21 = pHVar21 + (((uint)(uVar31 >> 8) & 0xffffff & kBitMask[bVar1 - 8] & 0x7f) +
                            (uint)pHVar21->value);
        bVar1 = pHVar21->bits;
      }
      (s->br).bit_pos_ = (uint)bVar1 + iVar29;
      uVar19 = (uint)pHVar21->value;
LAB_00104a84:
      bVar1 = kCmdLut[uVar19].insert_len_extra_bits;
      uVar27 = 0;
      bVar28 = kCmdLut[uVar19].copy_len_extra_bits;
      bVar22 = kCmdLut[uVar19].context;
      uVar2 = kCmdLut[uVar19].insert_len_offset;
      uVar32 = (uint)uVar2;
      uVar3 = kCmdLut[uVar19].copy_len_offset;
      s->distance_code = (int)kCmdLut[uVar19].distance_code;
      s->distance_context = (uint)bVar22;
      s->dist_htree_index = s->dist_context_map_slice[bVar22];
      uVar30 = 0;
      if (bVar1 != 0) {
        uVar16 = (s->br).bit_pos_;
        iVar29 = -uVar16;
        while( true ) {
          uVar16 = uVar16 - 8;
          uVar19 = (uint)bVar1;
          if (uVar19 <= iVar29 + 0x40U) break;
          sVar4 = (s->br).avail_in;
          if (sVar4 == 0) goto LAB_00104bad;
          uVar31 = (s->br).val_;
          pbVar5 = (s->br).next_in;
          (s->br).val_ = uVar31 >> 8;
          (s->br).val_ = (ulong)*pbVar5 << 0x38 | uVar31 >> 8;
          (s->br).bit_pos_ = uVar16;
          (s->br).avail_in = sVar4 - 1;
          (s->br).next_in = pbVar5 + 1;
          iVar29 = iVar29 + 8;
        }
        uVar30 = (uint)((s->br).val_ >> (-(char)iVar29 & 0x3fU)) & kBitMask[uVar19];
        (s->br).bit_pos_ = uVar19 - iVar29;
      }
      if (bVar28 != 0) {
        uVar16 = (s->br).bit_pos_;
        iVar29 = -uVar16;
        while( true ) {
          uVar16 = uVar16 - 8;
          uVar19 = (uint)bVar28;
          if (uVar19 <= iVar29 + 0x40U) break;
          sVar4 = (s->br).avail_in;
          if (sVar4 == 0) goto LAB_00104bad;
          uVar31 = (s->br).val_;
          pbVar5 = (s->br).next_in;
          (s->br).val_ = uVar31 >> 8;
          (s->br).val_ = (ulong)*pbVar5 << 0x38 | uVar31 >> 8;
          (s->br).bit_pos_ = uVar16;
          (s->br).avail_in = sVar4 - 1;
          (s->br).next_in = pbVar5 + 1;
          iVar29 = iVar29 + 8;
        }
        uVar27 = (uint)((s->br).val_ >> (-(char)iVar29 & 0x3fU)) & kBitMask[uVar19];
        (s->br).bit_pos_ = uVar19 - iVar29;
      }
      iVar29 = uVar27 + uVar3;
      s->copy_length = iVar29;
      s->block_length[1] = s->block_length[1] - 1;
      uVar30 = uVar30 + uVar2;
      if ((s->field_0x338 & 0x40) != 0) {
        s->commands[s->commands_size].copy_len = iVar29;
      }
      uVar32 = 0;
      if (uVar30 != 0) {
        s->meta_block_remaining_len = s->meta_block_remaining_len - uVar30;
LAB_00104c2a:
        uVar31 = (ulong)uVar10;
        uVar32 = uVar30;
LAB_00104c30:
        s->state = BROTLI_STATE_COMMAND_INNER;
        iVar29 = (int)uVar31;
        if (s->trivial_literal_context == 0) {
          uVar31 = (ulong)iVar29;
          uVar11 = s->block_length[0];
          bVar1 = s->ringbuffer[(int)(iVar29 - 1U & s->ringbuffer_mask)];
          bVar28 = s->ringbuffer[(int)(iVar29 - 2U & s->ringbuffer_mask)];
          do {
            bVar22 = bVar1;
            if (uVar11 == 0) {
              iVar29 = SafeDecodeLiteralBlockSwitch(s,(int)uVar31);
              if (iVar29 == 0) goto LAB_001051ce;
              if (s->trivial_literal_context != 0) goto LAB_00104c30;
            }
            pHVar21 = (s->literal_hgroup).htrees
                      [s->context_map_slice
                       [s->context_lookup[(ulong)bVar28 + 0x100] | s->context_lookup[bVar22]]];
            for (uVar10 = (s->br).bit_pos_ - 0x32; uVar10 < 0xf; uVar10 = uVar10 - 8) {
              sVar4 = (s->br).avail_in;
              if (sVar4 == 0) {
                iVar29 = SafeDecodeSymbol(pHVar21,br,&local_4c);
                if (iVar29 == 0) goto LAB_001051ce;
                bVar1 = (byte)local_4c;
                goto LAB_00104ea1;
              }
              uVar25 = (s->br).val_;
              pbVar5 = (s->br).next_in;
              (s->br).val_ = uVar25 >> 8;
              (s->br).val_ = (ulong)*pbVar5 << 0x38 | uVar25 >> 8;
              (s->br).bit_pos_ = uVar10 + 0x2a;
              (s->br).avail_in = sVar4 - 1;
              (s->br).next_in = pbVar5 + 1;
            }
            iVar29 = uVar10 + 0x32;
            uVar25 = br->val_ >> ((byte)iVar29 & 0x3f);
            pHVar21 = pHVar21 + (uVar25 & 0xff);
            uVar30 = (uint)pHVar21->bits;
            if (8 < uVar30) {
              iVar29 = uVar10 + 0x3a;
              pHVar21 = pHVar21 + (((uint)(uVar25 >> 8) & 0xffffff & kBitMask[pHVar21->bits - 8] &
                                   0x7f) + (uint)pHVar21->value);
              uVar30 = (uint)pHVar21->bits;
            }
            (s->br).bit_pos_ = uVar30 + iVar29;
            bVar1 = (byte)pHVar21->value;
LAB_00104ea1:
            s->ringbuffer[uVar31] = bVar1;
            uVar30 = s->ringbuffer_size;
            uVar11 = s->block_length[0] - 1;
            s->block_length[0] = uVar11;
            uVar31 = uVar31 + 1;
            if (uVar30 == (uint)uVar31) goto LAB_0010548f;
            uVar32 = uVar32 - 1;
            bVar28 = bVar22;
            if (uVar32 == 0) goto LAB_00104f02;
          } while( true );
        }
        uVar31 = (ulong)iVar29;
        uVar11 = s->block_length[0];
        do {
          if (uVar11 == 0) {
            iVar29 = SafeDecodeLiteralBlockSwitch(s,(int)uVar31);
            if (iVar29 == 0) goto LAB_001051ce;
            if (s->trivial_literal_context == 0) goto LAB_00104c30;
          }
          pHVar21 = s->literal_htree;
          for (uVar10 = (s->br).bit_pos_ - 0x32; uVar10 < 0xf; uVar10 = uVar10 - 8) {
            sVar4 = (s->br).avail_in;
            if (sVar4 == 0) {
              iVar29 = SafeDecodeSymbol(pHVar21,br,&local_4c);
              uVar10 = local_4c;
              if (iVar29 == 0) goto LAB_001051ce;
              goto LAB_00104d1a;
            }
            uVar25 = (s->br).val_;
            pbVar5 = (s->br).next_in;
            (s->br).val_ = uVar25 >> 8;
            (s->br).val_ = (ulong)*pbVar5 << 0x38 | uVar25 >> 8;
            (s->br).bit_pos_ = uVar10 + 0x2a;
            (s->br).avail_in = sVar4 - 1;
            (s->br).next_in = pbVar5 + 1;
          }
          iVar29 = uVar10 + 0x32;
          uVar25 = br->val_ >> ((byte)iVar29 & 0x3f);
          pHVar21 = pHVar21 + (uVar25 & 0xff);
          uVar30 = (uint)pHVar21->bits;
          if (8 < uVar30) {
            iVar29 = uVar10 + 0x3a;
            pHVar21 = pHVar21 + (((uint)(uVar25 >> 8) & 0xffffff & kBitMask[pHVar21->bits - 8] &
                                 0x7f) + (uint)pHVar21->value);
            uVar30 = (uint)pHVar21->bits;
          }
          (s->br).bit_pos_ = uVar30 + iVar29;
          uVar10 = (uint)pHVar21->value;
LAB_00104d1a:
          s->ringbuffer[uVar31] = (uint8_t)uVar10;
          uVar30 = s->ringbuffer_size;
          uVar11 = s->block_length[0] - 1;
          s->block_length[0] = uVar11;
          uVar31 = uVar31 + 1;
          if (uVar30 == (uint)uVar31) goto LAB_0010548f;
          uVar32 = uVar32 - 1;
          if (uVar32 == 0) goto LAB_00104f02;
        } while( true );
      }
      goto switchD_00104950_caseD_9;
    }
    iVar29 = SafeDecodeCommandBlockSwitch(s,uVar10);
  } while (iVar29 != 0);
  goto LAB_001051d1;
LAB_00104bad:
  (s->br).val_ = (uint64_t)local_38;
  (s->br).bit_pos_ = uVar11;
  (s->br).next_in = local_40;
LAB_00104bc7:
  (s->br).avail_in = (size_t)local_48;
  uVar30 = uVar10;
LAB_001051d1:
  BVar12 = BROTLI_DECODER_NEEDS_MORE_INPUT;
  goto LAB_001051d4;
LAB_001051ce:
  uVar30 = (uint)uVar31;
  goto LAB_001051d1;
LAB_0010548f:
  s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
LAB_00105495:
  uVar32 = uVar32 - 1;
  goto LAB_00105498;
LAB_00104f02:
  uVar32 = 0;
  uVar30 = (uint)uVar31;
  uVar10 = uVar30;
  if (s->meta_block_remaining_len < 1) {
    s->state = BROTLI_STATE_METABLOCK_DONE;
    uVar32 = 0;
    BVar12 = BROTLI_DECODER_SUCCESS;
    goto LAB_001051d4;
  }
switchD_00104950_caseD_9:
  s->state = BROTLI_STATE_COMMAND_POST_DECODE_LITERALS;
  iVar29 = s->distance_code;
  if (iVar29 < 0) {
    uVar30 = uVar10;
    if ((s->block_length[2] == 0) && (iVar29 = SafeDecodeDistanceBlockSwitch(s), iVar29 == 0))
    goto LAB_001051d1;
    pHVar21 = (s->distance_hgroup).htrees[s->dist_htree_index];
    pbVar5 = (byte *)(s->br).val_;
    uVar11 = (s->br).bit_pos_;
    local_38 = (s->br).next_in;
    local_40 = (byte *)(s->br).avail_in;
    iVar18 = 0;
    iVar29 = -0x32;
    iVar20 = -8;
    pbVar15 = pbVar5;
    pbVar24 = local_38;
    pbVar14 = local_40;
    while( true ) {
      pbVar14 = pbVar14 + -1;
      if (0xe < iVar29 + uVar11) break;
      if (pbVar14 == (byte *)0xffffffffffffffff) {
        iVar29 = SafeDecodeSymbol(pHVar21,br,&local_4c);
        uVar19 = local_4c;
        if (iVar29 == 0) goto LAB_001051d1;
        goto LAB_001052cd;
      }
      (s->br).val_ = (ulong)pbVar15 >> 8;
      pbVar15 = (byte *)((ulong)pbVar15 >> 8 | (ulong)*pbVar24 << 0x38);
      (s->br).val_ = (uint64_t)pbVar15;
      (s->br).bit_pos_ = iVar20 + uVar11;
      (s->br).avail_in = (size_t)pbVar14;
      (s->br).next_in = pbVar24 + 1;
      iVar18 = iVar18 + 8;
      iVar20 = iVar20 + -8;
      iVar29 = iVar29 + -8;
      pbVar24 = pbVar24 + 1;
    }
    iVar29 = uVar11 - iVar18;
    uVar31 = (ulong)pbVar15 >> ((byte)iVar29 & 0x3f);
    pHVar21 = pHVar21 + (uVar31 & 0xff);
    uVar30 = (uint)pHVar21->bits;
    if (8 < uVar30) {
      iVar29 = (uVar11 - iVar18) + 8;
      pHVar21 = pHVar21 + (((uint)(uVar31 >> 8) & 0xffffff & kBitMask[pHVar21->bits - 8] & 0x7f) +
                          (uint)pHVar21->value);
      uVar30 = (uint)pHVar21->bits;
    }
    (s->br).bit_pos_ = uVar30 + iVar29;
    uVar19 = (uint)pHVar21->value;
LAB_001052cd:
    uVar16 = s->block_length[2];
    s->block_length[2] = uVar16 - 1;
    s->distance_context = 0;
    if (0xf < uVar19) {
      bVar1 = *(byte *)((long)s->trivial_literal_contexts + (ulong)uVar19 + 0x20);
      uVar30 = 0;
      uVar27 = 0;
      if (bVar1 != 0) {
        uVar17 = (s->br).bit_pos_;
        iVar29 = -uVar17;
        while( true ) {
          uVar17 = uVar17 - 8;
          uVar23 = (uint)bVar1;
          if (uVar23 <= iVar29 + 0x40U) break;
          sVar4 = (s->br).avail_in;
          if (sVar4 == 0) {
            s->block_length[2] = uVar16;
            (s->br).val_ = (uint64_t)pbVar5;
            (s->br).bit_pos_ = uVar11;
            (s->br).next_in = local_38;
            local_48 = local_40;
            goto LAB_00104bc7;
          }
          uVar31 = (s->br).val_;
          pbVar24 = (s->br).next_in;
          (s->br).val_ = uVar31 >> 8;
          (s->br).val_ = (ulong)*pbVar24 << 0x38 | uVar31 >> 8;
          (s->br).bit_pos_ = uVar17;
          (s->br).avail_in = sVar4 - 1;
          (s->br).next_in = pbVar24 + 1;
          iVar29 = iVar29 + 8;
        }
        uVar27 = (uint)((s->br).val_ >> (-(char)iVar29 & 0x3fU)) & kBitMask[uVar23];
        (s->br).bit_pos_ = uVar23 - iVar29;
        local_48 = pbVar5;
      }
      iVar29 = (uVar27 << ((byte)s->distance_postfix_bits & 0x1f)) +
               *(int *)((long)&s->arena + (ulong)uVar19 * 4 + 0x220);
      goto LAB_00104f4d;
    }
    s->distance_code = uVar19;
    if (uVar19 < 4) {
      uVar30 = 1 >> ((byte)uVar19 & 0x1f);
      s->distance_context = uVar30;
      iVar29 = s->dist_rb[~uVar19 + s->dist_rb_idx & 3];
      s->distance_code = iVar29;
      s->dist_rb_idx = s->dist_rb_idx - uVar30;
    }
    else {
      iVar29 = uVar19 - 4;
      iVar20 = 3;
      if (9 < uVar19) {
        iVar29 = uVar19 - 10;
        iVar20 = 10;
      }
      iVar20 = s->dist_rb[iVar20 + s->dist_rb_idx & 3] +
               (0x605142U >> ((byte)(iVar29 << 2) & 0x1f) & 7) + -3;
      iVar29 = 0x7fffffff;
      if (0 < iVar20) {
        iVar29 = iVar20;
      }
      s->distance_code = iVar29;
      uVar30 = 0;
    }
  }
  else {
    uVar30 = (uint)(iVar29 == 0);
    s->distance_context = (uint)(iVar29 == 0);
    uVar32 = s->dist_rb_idx - 1;
    s->dist_rb_idx = uVar32;
    iVar29 = s->dist_rb[uVar32 & 3];
LAB_00104f4d:
    s->distance_code = iVar29;
  }
  uVar32 = s->max_backward_distance;
  uVar19 = s->max_distance;
  if (uVar19 != uVar32) {
    uVar19 = uVar32;
    if ((int)uVar10 < (int)uVar32) {
      uVar19 = uVar10;
    }
    s->max_distance = uVar19;
  }
  if ((s->field_0x338 & 0x40) != 0) {
    pBVar6 = s->commands;
    sVar4 = s->commands_size;
    pBVar6[sVar4].distance = iVar29;
    pBVar6[sVar4].position = uVar10;
    pBVar6[sVar4].max_distance = uVar19;
    s->commands_size = sVar4 + 1;
  }
  uVar32 = s->copy_length;
  uVar31 = (ulong)uVar32;
  if ((int)uVar19 < iVar29) {
    if (0x7ffffffc < iVar29) {
      return BROTLI_DECODER_ERROR_FORMAT_DISTANCE;
    }
    if (0x14 < uVar32 - 4) {
      return BROTLI_DECODER_ERROR_FORMAT_DICTIONARY;
    }
    pBVar7 = s->dictionary;
    pBVar8 = s->transforms;
    uVar27 = kBitMask[pBVar7->size_bits_by_length[uVar31]];
    iVar20 = (int)(iVar29 + ~uVar19) >> (pBVar7->size_bits_by_length[uVar31] & 0x1f);
    uVar11 = pBVar7->offsets_by_length[uVar31];
    s->dist_rb_idx = s->dist_rb_idx + uVar30;
    if (pBVar7->data == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET;
    }
    if ((int)pBVar8->num_transforms <= iVar20) {
      return BROTLI_DECODER_ERROR_FORMAT_TRANSFORM;
    }
    puVar26 = pBVar7->data + (long)(int)((uVar27 & iVar29 + ~uVar19) * uVar32) + (long)(int)uVar11;
    if (iVar20 == pBVar8->cutOffTransforms[0]) {
      memcpy(s->ringbuffer + (int)uVar10,puVar26,uVar31);
      uVar30 = uVar32;
    }
    else {
      uVar30 = BrotliTransformDictionaryWord(s->ringbuffer + (int)uVar10,puVar26,uVar31,pBVar8);
    }
    s->meta_block_remaining_len = s->meta_block_remaining_len - uVar30;
    uVar30 = uVar10 + uVar30;
    if ((int)uVar30 < s->ringbuffer_size) goto LAB_0010524b;
    s->state = BROTLI_STATE_COMMAND_POST_WRITE_1;
  }
  else {
    lVar13 = (long)(int)uVar10;
    uVar27 = uVar10 - iVar29 & s->ringbuffer_mask;
    puVar26 = s->ringbuffer;
    uVar30 = uVar32 + uVar10;
    uVar19 = s->dist_rb_idx;
    s->dist_rb[uVar19 & 3] = iVar29;
    s->dist_rb_idx = uVar19 + 1;
    s->meta_block_remaining_len = s->meta_block_remaining_len - uVar32;
    uVar9 = *(undefined8 *)(puVar26 + (int)uVar27 + 8);
    *(undefined8 *)(puVar26 + lVar13) = *(undefined8 *)(puVar26 + (int)uVar27);
    *(undefined8 *)(puVar26 + lVar13 + 8) = uVar9;
    if (((((int)(uVar27 + uVar32) <= (int)uVar10) || ((int)uVar30 <= (int)uVar27)) &&
        ((int)uVar30 < s->ringbuffer_size)) && ((int)(uVar27 + uVar32) < s->ringbuffer_size)) {
      if (0x10 < (int)uVar32) {
        if (uVar32 < 0x21) {
          uVar9 = *(undefined8 *)(puVar26 + (long)(int)uVar27 + 0x18);
          *(undefined8 *)(puVar26 + lVar13 + 0x10) =
               *(undefined8 *)(puVar26 + (long)(int)uVar27 + 0x10);
          *(undefined8 *)(puVar26 + lVar13 + 0x18) = uVar9;
        }
        else {
          memcpy(puVar26 + lVar13 + 0x10,puVar26 + (long)(int)uVar27 + 0x10,(ulong)(uVar32 - 0x10));
        }
      }
LAB_0010524b:
      uVar10 = uVar30;
      if (s->meta_block_remaining_len < 1) {
        s->state = BROTLI_STATE_METABLOCK_DONE;
        BVar12 = BROTLI_DECODER_SUCCESS;
LAB_001051d4:
        s->pos = uVar30;
        s->loop_counter = uVar32;
        return BVar12;
      }
      goto switchD_00104950_caseD_7;
    }
LAB_001050b2:
    iVar29 = uVar10 - s->ringbuffer_size;
    iVar20 = -(int)lVar13;
    while (uVar32 = (uint)uVar31, 0 < (int)uVar32) {
      s->ringbuffer[lVar13] = s->ringbuffer[(int)lVar13 - s->distance_code & s->ringbuffer_mask];
      lVar13 = lVar13 + 1;
      iVar20 = iVar20 + -1;
      uVar31 = (ulong)(uVar32 - 1);
      iVar29 = iVar29 + 1;
      if (iVar29 == 0) {
        uVar30 = -iVar20;
        s->state = BROTLI_STATE_COMMAND_POST_WRITE_2;
        goto LAB_00105495;
      }
    }
    uVar30 = -iVar20;
    uVar32 = uVar32 - 1;
    uVar31 = (ulong)uVar32;
    uVar10 = uVar30;
    if (0 < s->meta_block_remaining_len) goto switchD_00104950_caseD_7;
    s->state = BROTLI_STATE_METABLOCK_DONE;
  }
LAB_00105498:
  BVar12 = BROTLI_DECODER_SUCCESS;
  goto LAB_001051d4;
}

Assistant:

static BROTLI_INLINE BrotliDecoderErrorCode ProcessCommandsInternal(
    int safe, BrotliDecoderState* s) {
  int pos = s->pos;
  int i = s->loop_counter;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
  BrotliBitReader* br = &s->br;
  if (!CheckInputAmount(safe, br, 28)) {
    result = BROTLI_DECODER_NEEDS_MORE_INPUT;
    goto saveStateAndReturn;
  }
  if (!safe) {
    BROTLI_UNUSED(BrotliWarmupBitReader(br));
  }

  /* Jump into state machine. */
  if (s->state == BROTLI_STATE_COMMAND_BEGIN) {
    goto CommandBegin;
  } else if (s->state == BROTLI_STATE_COMMAND_INNER) {
    goto CommandInner;
  } else if (s->state == BROTLI_STATE_COMMAND_POST_DECODE_LITERALS) {
    goto CommandPostDecodeLiterals;
  } else if (s->state == BROTLI_STATE_COMMAND_POST_WRAP_COPY) {
    goto CommandPostWrapCopy;
  } else {
    return BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }

CommandBegin:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_BEGIN;
  }
  if (!CheckInputAmount(safe, br, 28)) {  /* 156 bits + 7 bytes */
    s->state = BROTLI_STATE_COMMAND_BEGIN;
    result = BROTLI_DECODER_NEEDS_MORE_INPUT;
    goto saveStateAndReturn;
  }
  if (BROTLI_PREDICT_FALSE(s->block_length[1] == 0)) {
    BROTLI_SAFE(DecodeCommandBlockSwitch(s, pos));
    goto CommandBegin;
  }
  /* Read the insert/copy length in the command. */
  BROTLI_SAFE(ReadCommand(s, br, &i));
  BROTLI_LOG(("[ProcessCommandsInternal] pos = %d insert = %d copy = %d\n",
              pos, i, s->copy_length));
  /* Save backward reference info if needed */
  if (s->save_info_for_recompression) {
    s->commands[s->commands_size].copy_len = s->copy_length;
  }
  if (i == 0) {
    goto CommandPostDecodeLiterals;
  }
  s->meta_block_remaining_len -= i;

CommandInner:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_INNER;
  }
  /* Read the literals in the command. */
  if (s->trivial_literal_context) {
    uint32_t bits;
    uint32_t value;
    PreloadSymbol(safe, s->literal_htree, br, &bits, &value);
    do {
      if (!CheckInputAmount(safe, br, 28)) {  /* 162 bits + 7 bytes */
        s->state = BROTLI_STATE_COMMAND_INNER;
        result = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto saveStateAndReturn;
      }
      if (BROTLI_PREDICT_FALSE(s->block_length[0] == 0)) {
        BROTLI_SAFE(DecodeLiteralBlockSwitch(s, pos));
        PreloadSymbol(safe, s->literal_htree, br, &bits, &value);
        if (!s->trivial_literal_context) goto CommandInner;
      }
      if (!safe) {
        s->ringbuffer[pos] =
            (uint8_t)ReadPreloadedSymbol(s->literal_htree, br, &bits, &value);
      } else {
        uint32_t literal;
        if (!SafeReadSymbol(s->literal_htree, br, &literal)) {
          result = BROTLI_DECODER_NEEDS_MORE_INPUT;
          goto saveStateAndReturn;
        }
        s->ringbuffer[pos] = (uint8_t)literal;
      }
      --s->block_length[0];
      BROTLI_LOG_ARRAY_INDEX(s->ringbuffer, pos);
      ++pos;
      if (BROTLI_PREDICT_FALSE(pos == s->ringbuffer_size)) {
        s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
        --i;
        goto saveStateAndReturn;
      }
    } while (--i != 0);
  } else {
    uint8_t p1 = s->ringbuffer[(pos - 1) & s->ringbuffer_mask];
    uint8_t p2 = s->ringbuffer[(pos - 2) & s->ringbuffer_mask];
    do {
      const HuffmanCode* hc;
      uint8_t context;
      if (!CheckInputAmount(safe, br, 28)) {  /* 162 bits + 7 bytes */
        s->state = BROTLI_STATE_COMMAND_INNER;
        result = BROTLI_DECODER_NEEDS_MORE_INPUT;
        goto saveStateAndReturn;
      }
      if (BROTLI_PREDICT_FALSE(s->block_length[0] == 0)) {
        BROTLI_SAFE(DecodeLiteralBlockSwitch(s, pos));
        if (s->trivial_literal_context) goto CommandInner;
      }
      context = BROTLI_CONTEXT(p1, p2, s->context_lookup);
      BROTLI_LOG_UINT(context);
      hc = s->literal_hgroup.htrees[s->context_map_slice[context]];
      p2 = p1;
      if (!safe) {
        p1 = (uint8_t)ReadSymbol(hc, br);
      } else {
        uint32_t literal;
        if (!SafeReadSymbol(hc, br, &literal)) {
          result = BROTLI_DECODER_NEEDS_MORE_INPUT;
          goto saveStateAndReturn;
        }
        p1 = (uint8_t)literal;
      }
      s->ringbuffer[pos] = p1;
      --s->block_length[0];
      BROTLI_LOG_UINT(s->context_map_slice[context]);
      BROTLI_LOG_ARRAY_INDEX(s->ringbuffer, pos & s->ringbuffer_mask);
      ++pos;
      if (BROTLI_PREDICT_FALSE(pos == s->ringbuffer_size)) {
        s->state = BROTLI_STATE_COMMAND_INNER_WRITE;
        --i;
        goto saveStateAndReturn;
      }
    } while (--i != 0);
  }
  BROTLI_LOG_UINT(s->meta_block_remaining_len);
  if (BROTLI_PREDICT_FALSE(s->meta_block_remaining_len <= 0)) {
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  }

CommandPostDecodeLiterals:
  if (safe) {
    s->state = BROTLI_STATE_COMMAND_POST_DECODE_LITERALS;
  }
  if (s->distance_code >= 0) {
    /* Implicit distance case. */
    s->distance_context = s->distance_code ? 0 : 1;
    --s->dist_rb_idx;
    s->distance_code = s->dist_rb[s->dist_rb_idx & 3];
  } else {
    /* Read distance code in the command, unless it was implicitly zero. */
    if (BROTLI_PREDICT_FALSE(s->block_length[2] == 0)) {
      BROTLI_SAFE(DecodeDistanceBlockSwitch(s));
    }
    BROTLI_SAFE(ReadDistance(s, br));
  }
  BROTLI_LOG(("[ProcessCommandsInternal] pos = %d distance = %d\n",
              pos, s->distance_code));
  if (s->max_distance != s->max_backward_distance) {
    s->max_distance =
        (pos < s->max_backward_distance) ? pos : s->max_backward_distance;
  }
  /* Save backward reference info if needed */
  if (s->save_info_for_recompression) {
    s->commands[s->commands_size].distance = s->distance_code;
    s->commands[s->commands_size].position = pos;
    s->commands[s->commands_size].max_distance = s->max_distance;
    ++s->commands_size;
  }
  i = s->copy_length;
  /* Apply copy of LZ77 back-reference, or static dictionary reference if
     the distance is larger than the max LZ77 distance */
  if (s->distance_code > s->max_distance) {
    /* The maximum allowed distance is BROTLI_MAX_ALLOWED_DISTANCE = 0x7FFFFFFC.
       With this choice, no signed overflow can occur after decoding
       a special distance code (e.g., after adding 3 to the last distance). */
    if (s->distance_code > BROTLI_MAX_ALLOWED_DISTANCE) {
      BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
          "len: %d bytes left: %d\n",
          pos, s->distance_code, i, s->meta_block_remaining_len));
      return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_DISTANCE);
    }
    if (i >= BROTLI_MIN_DICTIONARY_WORD_LENGTH &&
        i <= BROTLI_MAX_DICTIONARY_WORD_LENGTH) {
      int address = s->distance_code - s->max_distance - 1;
      const BrotliDictionary* words = s->dictionary;
      const BrotliTransforms* transforms = s->transforms;
      int offset = (int)s->dictionary->offsets_by_length[i];
      uint32_t shift = s->dictionary->size_bits_by_length[i];

      int mask = (int)BitMask(shift);
      int word_idx = address & mask;
      int transform_idx = address >> shift;
      /* Compensate double distance-ring-buffer roll. */
      s->dist_rb_idx += s->distance_context;
      offset += word_idx * i;
      if (BROTLI_PREDICT_FALSE(!words->data)) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_DICTIONARY_NOT_SET);
      }
      if (transform_idx < (int)transforms->num_transforms) {
        const uint8_t* word = &words->data[offset];
        int len = i;
        if (transform_idx == transforms->cutOffTransforms[0]) {
          memcpy(&s->ringbuffer[pos], word, (size_t)len);
          BROTLI_LOG(("[ProcessCommandsInternal] dictionary word: [%.*s]\n",
                      len, word));
        } else {
          len = BrotliTransformDictionaryWord(&s->ringbuffer[pos], word, len,
              transforms, transform_idx);
          BROTLI_LOG(("[ProcessCommandsInternal] dictionary word: [%.*s],"
                      " transform_idx = %d, transformed: [%.*s]\n",
                      i, word, transform_idx, len, &s->ringbuffer[pos]));
        }
        pos += len;
        s->meta_block_remaining_len -= len;
        if (pos >= s->ringbuffer_size) {
          s->state = BROTLI_STATE_COMMAND_POST_WRITE_1;
          goto saveStateAndReturn;
        }
      } else {
        BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
            "len: %d bytes left: %d\n",
            pos, s->distance_code, i, s->meta_block_remaining_len));
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_TRANSFORM);
      }
    } else {
      BROTLI_LOG(("Invalid backward reference. pos: %d distance: %d "
          "len: %d bytes left: %d\n",
          pos, s->distance_code, i, s->meta_block_remaining_len));
      return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_DICTIONARY);
    }
  } else {
    int src_start = (pos - s->distance_code) & s->ringbuffer_mask;
    uint8_t* copy_dst = &s->ringbuffer[pos];
    uint8_t* copy_src = &s->ringbuffer[src_start];
    int dst_end = pos + i;
    int src_end = src_start + i;
    /* Update the recent distances cache. */
    s->dist_rb[s->dist_rb_idx & 3] = s->distance_code;
    ++s->dist_rb_idx;
    s->meta_block_remaining_len -= i;
    /* There are 32+ bytes of slack in the ring-buffer allocation.
       Also, we have 16 short codes, that make these 16 bytes irrelevant
       in the ring-buffer. Let's copy over them as a first guess. */
    memmove16(copy_dst, copy_src);
    if (src_end > pos && dst_end > src_start) {
      /* Regions intersect. */
      goto CommandPostWrapCopy;
    }
    if (dst_end >= s->ringbuffer_size || src_end >= s->ringbuffer_size) {
      /* At least one region wraps. */
      goto CommandPostWrapCopy;
    }
    pos += i;
    if (i > 16) {
      if (i > 32) {
        memcpy(copy_dst + 16, copy_src + 16, (size_t)(i - 16));
      } else {
        /* This branch covers about 45% cases.
           Fixed size short copy allows more compiler optimizations. */
        memmove16(copy_dst + 16, copy_src + 16);
      }
    }
  }
  BROTLI_LOG_UINT(s->meta_block_remaining_len);
  if (s->meta_block_remaining_len <= 0) {
    /* Next metablock, if any. */
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  } else {
    goto CommandBegin;
  }
CommandPostWrapCopy:
  {
    int wrap_guard = s->ringbuffer_size - pos;
    while (--i >= 0) {
      s->ringbuffer[pos] =
          s->ringbuffer[(pos - s->distance_code) & s->ringbuffer_mask];
      ++pos;
      if (BROTLI_PREDICT_FALSE(--wrap_guard == 0)) {
        s->state = BROTLI_STATE_COMMAND_POST_WRITE_2;
        goto saveStateAndReturn;
      }
    }
  }
  if (s->meta_block_remaining_len <= 0) {
    /* Next metablock, if any. */
    s->state = BROTLI_STATE_METABLOCK_DONE;
    goto saveStateAndReturn;
  } else {
    goto CommandBegin;
  }

saveStateAndReturn:
  s->pos = pos;
  s->loop_counter = i;
  return result;
}